

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O2

Alloc<void> __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
clear_slab(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          BackendSlabMetadata *meta,smallsizeclass_t sizeclass)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  address_t n_1;
  ulong uVar4;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  BVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  address_t c_1;
  ulong uVar10;
  long lVar11;
  long lVar12;
  conditional_t<Config::Options_AllocOwnsLocalState,_LocalState,_LocalState_*> *domesticate;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  uVar10 = (ulong)meta >> 3;
  uVar1 = (meta->
          super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
          ).free_queue.length._M_elems[0];
  uVar2 = (meta->
          super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
          ).free_queue.length._M_elems[1];
  bVar3 = uVar1 <= uVar2;
  puVar6 = (ulong *)((long)(meta->
                           super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                           ).free_queue.head._M_elems + (ulong)((uint)bVar3 * 8));
  local_40 = freelist::Object::key_root.key_next ^ uVar10;
  **(ulong **)
    ((long)(meta->
           super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
           ).free_queue.end._M_elems + (ulong)((uint)bVar3 * 8)) = local_40;
  local_40 = local_40 ^ *puVar6;
  local_48 = ((freelist::Object::key_root.key2 ^ uVar10) + local_40) *
             (freelist::Object::key_root.key1 + (long)puVar6);
  *(ulong **)
   ((long)(meta->
          super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
          ).free_queue.end._M_elems + (ulong)((uint)bVar3 * 8)) = puVar6;
  (meta->
  super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
  ).free_queue.length._M_elems[bVar3] = 0;
  uVar4 = (ulong)(meta->
                 super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                 ).free_queue.length._M_elems[uVar2 < uVar1];
  domesticate = &this->backend_state;
  local_38 = uVar10;
  BVar5 = freelist::
          Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
          ::
          take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::clear_slab(snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>*,unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                    ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                      *)&local_48,&freelist::Object::key_root,(anon_class_8_1_7a75751d)domesticate);
  lVar12 = 1;
  while (local_40 != 0) {
    freelist::
    Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
    ::
    take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::clear_slab(snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>*,unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
              ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                *)&local_48,&freelist::Object::key_root,(anon_class_8_1_7a75751d)domesticate);
    lVar12 = lVar12 + 1;
  }
  uVar8 = (ulong)((uint)sizeclass & 0x7f) ^ 0x40;
  if (*(ushort *)(sizeclass_metadata + uVar8 * 4 + 0x1000) - uVar4 != lVar12) {
    report_fatal_error<1024ul,char_const*,char_const*,char_const*,char_const*>
              ("Check fail: {} in {} on {} \n",
               "(count + more) == snmalloc::sizeclass_to_slab_object_count(sizeclass)",
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/snmalloc-src/src/snmalloc/backend_helpers/../mem/corealloc.h"
               ,"1216");
  }
  lVar9 = lVar12;
  if (uVar4 != 0) {
    bVar3 = (meta->
            super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
            ).free_queue.length._M_elems[0] <=
            (meta->
            super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
            ).free_queue.length._M_elems[1];
    uVar7 = (ulong)((uint)bVar3 * 8);
    local_40 = freelist::Object::key_root.key_next ^ uVar10;
    **(ulong **)
      ((long)(meta->
             super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
             ).free_queue.end._M_elems + uVar7) = local_40;
    lVar11 = (long)(meta->
                   super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                   ).free_queue.head._M_elems + uVar7;
    local_40 = local_40 ^
               *(ulong *)((long)(meta->
                                super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                                ).free_queue.head._M_elems + uVar7);
    local_48 = ((freelist::Object::key_root.key2 ^ uVar10) + local_40) *
               (freelist::Object::key_root.key1 + lVar11);
    *(long *)((long)(meta->
                    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                    ).free_queue.end._M_elems + uVar7) = lVar11;
    (meta->
    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
    ).free_queue.length._M_elems[bVar3] = 0;
    local_38 = uVar10;
    while (local_40 != 0) {
      freelist::
      Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
      ::
      take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::clear_slab(snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>*,unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                  *)&local_48,&freelist::Object::key_root,(anon_class_8_1_7a75751d)domesticate);
      lVar9 = lVar9 + 1;
    }
  }
  if (lVar9 - uVar4 != lVar12) {
    report_fatal_error<1024ul,char_const*,char_const*,char_const*,char_const*>
              ("Check fail: {} in {} on {} \n",
               "count == snmalloc::sizeclass_to_slab_object_count(sizeclass)",
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/snmalloc-src/src/snmalloc/backend_helpers/../mem/corealloc.h"
               ,"1232");
  }
  return (void *)((ulong)BVar5.unsafe_capptr &
                 ~*(ulong *)(sizeclass_metadata + (ulong)(uint)((int)uVar8 << 5) + 8));
}

Assistant:

capptr::Alloc<void>
    clear_slab(BackendSlabMetadata* meta, smallsizeclass_t sizeclass)
    {
      auto key_tweak = meta->as_key_tweak();
      freelist::Iter<> fl;
      auto more =
        meta->free_queue.close(fl, freelist::Object::key_root, key_tweak);
      UNUSED(more);
      auto local_state = backend_state_ptr();
      auto domesticate = [local_state](freelist::QueuePtr p)
                           SNMALLOC_FAST_PATH_LAMBDA {
                             return capptr_domesticate<Config>(local_state, p);
                           };
      capptr::Alloc<void> p = finish_alloc_no_zero(
        fl.take(freelist::Object::key_root, domesticate), sizeclass);

      // If clear_meta is requested, we should also walk the free list to clear
      // it.
      // TODO: we could optimise the clear_meta case to not walk the free list
      // and instead just clear the whole slab, but that requires amplification.
      if constexpr (
        mitigations(freelist_teardown_validate) || mitigations(clear_meta))
      {
        // Check free list is well-formed on platforms with
        // integers as pointers.
        size_t count = 1; // Already taken one above.
        while (!fl.empty())
        {
          fl.take(freelist::Object::key_root, domesticate);
          count++;
        }
        // Check the list contains all the elements
        SNMALLOC_CHECK(
          (count + more) ==
          snmalloc::sizeclass_to_slab_object_count(sizeclass));

        if (more > 0)
        {
          auto no_more =
            meta->free_queue.close(fl, freelist::Object::key_root, key_tweak);
          SNMALLOC_ASSERT(no_more == 0);
          UNUSED(no_more);

          while (!fl.empty())
          {
            fl.take(freelist::Object::key_root, domesticate);
            count++;
          }
        }
        SNMALLOC_CHECK(
          count == snmalloc::sizeclass_to_slab_object_count(sizeclass));
      }
      auto start_of_slab = pointer_align_down<void>(
        p, snmalloc::sizeclass_to_slab_size(sizeclass));

#ifdef SNMALLOC_TRACING
      message<1024>(
        "Slab {} is unused, Object sizeclass {}",
        start_of_slab.unsafe_ptr(),
        sizeclass);
#endif
      return start_of_slab;
    }